

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_hdwallet.cpp
# Opt level: O3

string * __thiscall
cfd::api::HDWalletApi::GetPrivkeyFromExtkey
          (string *__return_storage_ptr__,HDWalletApi *this,string *extkey,NetType net_type,bool wif
          ,bool is_compressed)

{
  uint32_t uVar1;
  CfdException *this_00;
  uint32_t uVar2;
  Privkey privkey;
  ExtPrivkey ext_privkey;
  string local_c8;
  uint32_t local_a4;
  ExtPrivkey local_a0;
  
  core::ExtPrivkey::ExtPrivkey(&local_a0,extkey);
  uVar1 = core::ExtPrivkey::GetVersion(&local_a0);
  uVar2 = 0x4358394;
  if (net_type == kLiquidV1) {
    uVar2 = 0x488ade4;
  }
  if (net_type == kMainnet) {
    uVar2 = 0x488ade4;
  }
  if (uVar1 == uVar2) {
    core::ExtPrivkey::GetPrivkey((Privkey *)&local_c8,&local_a0);
    if (wif) {
      core::Privkey::ConvertWif_abi_cxx11_
                (__return_storage_ptr__,(Privkey *)&local_c8,net_type,is_compressed);
    }
    else {
      core::Privkey::GetHex_abi_cxx11_(__return_storage_ptr__,(Privkey *)&local_c8);
    }
    if (local_c8._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_c8._M_dataplus._M_p);
    }
    if (local_a0.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a0.tweak_sum_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_a0.privkey_.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a0.privkey_.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_a0.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a0.chaincode_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_a0.serialize_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a0.serialize_data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return __return_storage_ptr__;
  }
  local_c8._M_dataplus._M_p = "cfdapi_hdwallet.cpp";
  local_c8._M_string_length._0_4_ = 0x134;
  local_c8.field_2._M_allocated_capacity = (long)"CfdGetPrivkeyFromExtkey" + 3;
  local_a4 = core::ExtPrivkey::GetVersion(&local_a0);
  core::logger::log<unsigned_int&>
            ((CfdSourceLocation *)&local_c8,kCfdLogLevelWarning,"Version unmatch. key version: {}",
             &local_a4);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c8,"extkey networkType unmatch.","");
  core::CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_c8);
  __cxa_throw(this_00,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

std::string HDWalletApi::GetPrivkeyFromExtkey(
    const std::string& extkey, NetType net_type, bool wif,
    bool is_compressed) const {
  ExtPrivkey ext_privkey(extkey);
  uint32_t check_version = GetExtkeyVersion(ExtKeyType::kExtPrivkey, net_type);
  if (ext_privkey.GetVersion() != check_version) {
    warn(
        CFD_LOG_SOURCE, "Version unmatch. key version: {}",
        ext_privkey.GetVersion());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "extkey networkType unmatch.");
  }

  Privkey privkey = ext_privkey.GetPrivkey();
  if (wif) {
    return privkey.ConvertWif(net_type, is_compressed);
  } else {
    return privkey.GetHex();
  }
}